

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_reverse(lua_State *L)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  luaL_Buffer b;
  size_t local_2038;
  luaL_Buffer local_2030;
  
  pcVar2 = luaL_checklstring(L,1,&local_2038);
  luaL_buffinit(L,&local_2030);
  bVar3 = local_2038 != 0;
  local_2038 = local_2038 - 1;
  if (bVar3) {
    do {
      if (&stack0xffffffffffffffe8 <= local_2030.p) {
        luaL_prepbuffer(&local_2030);
      }
      pcVar1 = local_2030.p + 1;
      *local_2030.p = pcVar2[local_2038];
      bVar3 = local_2038 != 0;
      local_2038 = local_2038 - 1;
      local_2030.p = pcVar1;
    } while (bVar3);
  }
  luaL_pushresult(&local_2030);
  return 1;
}

Assistant:

static int str_reverse (lua_State *L) {
  size_t l;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  luaL_buffinit(L, &b);
  while (l--) luaL_addchar(&b, s[l]);
  luaL_pushresult(&b);
  return 1;
}